

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

bool __thiscall vmips::callfunc::used_register(callfunc *this,shared_ptr<vmips::VirtReg> *reg)

{
  bool bVar1;
  element_type *this_00;
  element_type *that;
  const_iterator __first;
  const_iterator __last;
  shared_ptr<vmips::VirtReg> *reg_local;
  callfunc *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->ret);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ret);
    that = std::__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)reg);
    bVar1 = VirtReg::operator==(this_00,that);
    if (bVar1) {
      return true;
    }
  }
  __first = std::
            vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
            ::begin(&this->call_with);
  __last = std::
           vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
           ::end(&this->call_with);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<vmips::VirtReg>const*,std::vector<std::shared_ptr<vmips::VirtReg>,std::allocator<std::shared_ptr<vmips::VirtReg>>>>,vmips::callfunc::used_register(std::shared_ptr<vmips::VirtReg>const&)const::__0>
                    ((__normal_iterator<const_std::shared_ptr<vmips::VirtReg>_*,_std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_std::shared_ptr<vmips::VirtReg>_*,_std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>_>
                      )__last._M_current,(anon_class_8_1_ba1d73f4_for__M_pred)reg);
  return bVar1;
}

Assistant:

bool callfunc::used_register(const std::shared_ptr<VirtReg> &reg) const {
    if (ret && *ret == *reg) return true;
    return std::any_of(call_with.begin(), call_with.end(),
                       [&](const std::shared_ptr<VirtReg> &t) { return *t == *reg; });
}